

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMainParseLoop
          (MessageGenerator *this,Printer *printer,bool use_parse_context)

{
  bool bVar1;
  Type type;
  int iVar2;
  uint32_t x;
  char *pcVar3;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  this_00;
  ulong uVar4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar5;
  size_type sVar6;
  const_reference ppFVar7;
  FieldGeneratorBase *__p;
  pointer pFVar8;
  AlphaNum *a;
  AlphaNum *a_00;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  string_view local_178;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_168;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  string local_130;
  string_view local_110;
  AlphaNum local_100;
  string local_d0;
  string_view local_b0;
  uint32_t local_a0;
  WireType local_9c;
  uint32_t tag;
  WireType wt;
  FieldDescriptor *field;
  undefined1 auStack_88 [4];
  int i;
  string_view local_78;
  basic_string_view<char,_std::char_traits<char>_> local_60 [2];
  undefined1 local_40 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  bool use_parse_context_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] = use_parse_context;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_40);
  pcVar3 = "input";
  if ((vars.
       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .settings_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_.soo_data[0xf] & 1) != 0) {
    pcVar3 = "ref input";
  }
  this_00 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)local_40,(key_arg<char[16]> *)"maybe_ref_input");
  std::__cxx11::string::operator=((string *)this_00,pcVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_60,
             "\n    uint tag;\n    while ((tag = input.ReadTag()) != 0) {\n    if ((tag & 7) == 4) {\n      // Abort on any end group tag.\n      return;\n    }\n    switch(tag) {\n  "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(printer,local_60[0]._M_len,local_60[0]._M_str);
  protobuf::io::Printer::Indent(printer);
  protobuf::io::Printer::Indent(printer);
  if ((this->has_extension_ranges_ & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88,
               "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  break;\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,_auStack_88);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,
               "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  }\n  break;\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_78);
  }
  field._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)field._4_4_;
    pvVar5 = fields_by_number(this);
    sVar6 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(pvVar5);
    if (sVar6 <= uVar4) break;
    pvVar5 = fields_by_number(this);
    ppFVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvVar5,(long)field._4_4_);
    _tag = *ppFVar7;
    type = FieldDescriptor::type(_tag);
    local_9c = protobuf::internal::WireFormat::WireTypeForFieldType(type);
    iVar2 = FieldDescriptor::number(_tag);
    local_a0 = protobuf::internal::WireFormatLite::MakeTag(iVar2,local_9c);
    bVar1 = FieldDescriptor::is_packable(_tag);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b0,"case $packed_tag$:\n");
      iVar2 = FieldDescriptor::number(_tag);
      x = protobuf::internal::WireFormatLite::MakeTag(iVar2,WIRETYPE_LENGTH_DELIMITED);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_100,x);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_d0,(lts_20250127 *)&local_100,a);
      protobuf::io::Printer::Print<char[11],std::__cxx11::string>
                (printer,local_b0,(char (*) [11])"packed_tag",&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_110,"case $tag$: {\n");
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&generator,local_a0);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&generator,a_00);
    protobuf::io::Printer::Print<char[4],std::__cxx11::string>
              (printer,local_110,(char (*) [4])0x1fdd9f0,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    protobuf::io::Printer::Indent(printer);
    __p = CreateFieldGeneratorInternal(this,_tag);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_168,__p);
    pFVar8 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_168);
    (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])
              (pFVar8,printer,
               (ulong)(vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.soo_data[0xf] & 1));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,"break;\n");
    protobuf::io::Printer::Print<>(printer,local_178);
    protobuf::io::Printer::Outdent(printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"}\n");
    protobuf::io::Printer::Print<>(printer,local_188);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_168);
    field._4_4_ = field._4_4_ + 1;
  }
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"}\n");
  protobuf::io::Printer::Print<>(printer,local_198);
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"}\n");
  protobuf::io::Printer::Print<>(printer,local_1a8);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_40);
  return;
}

Assistant:

void MessageGenerator::GenerateMainParseLoop(io::Printer* printer,
                                             bool use_parse_context) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["maybe_ref_input"] = use_parse_context ? "ref input" : "input";

  printer->Emit(R"csharp(
    uint tag;
    while ((tag = input.ReadTag()) != 0) {
    if ((tag & 7) == 4) {
      // Abort on any end group tag.
      return;
    }
    switch(tag) {
  )csharp");
  printer->Indent();
  printer->Indent();
  if (has_extension_ranges_) {
    printer->Print(vars,
                   "default:\n"
                   "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, "
                   "$maybe_ref_input$)) {\n"
                   "    _unknownFields = "
                   "pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, "
                   "$maybe_ref_input$);\n"
                   "  }\n"
                   "  break;\n");
  } else {
    printer->Print(
        vars,
        "default:\n"
        "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, "
        "$maybe_ref_input$);\n"
        "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32_t tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array
    // call; the two generated cases are the packed and unpacked tags.
    // TODO: Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print("case $packed_tag$:\n", "packed_tag",
                     absl::StrCat(internal::WireFormatLite::MakeTag(
                         field->number(),
                         internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", absl::StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer, use_parse_context);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n");  // switch
  printer->Outdent();
  printer->Print("}\n");  // while
}